

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

ON_SHA1_Hash *
ON_SHA1_Hash::FromString
          (ON_SHA1_Hash *__return_storage_ptr__,ON_wString string_to_parse,bool bParseLeasingSpaces,
          bool bParseInteriorSpace,bool bParseInteriorHyphen,ON_SHA1_Hash failure_return_value)

{
  wchar_t wVar1;
  int j;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  uint local_d8 [42];
  
  pwVar3 = ON_wString::operator_cast_to_wchar_t_(string_to_parse.m_s);
  if (pwVar3 == (wchar_t *)0x0) {
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
  }
  else {
    lVar8 = 0;
    memset(local_d8,0,0xa0);
    iVar2 = ON_wString::Length((ON_wString *)string_to_parse.m_s);
    pwVar4 = (wchar_t *)0x0;
    uVar5 = 0;
    while ((lVar8 < iVar2 && (uVar5 < 0x28))) {
      wVar1 = pwVar3[lVar8];
      uVar6 = wVar1 + L'\xffffffd0';
      if (uVar6 < 10) {
LAB_005b7af2:
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        local_d8[uVar7] = uVar6;
      }
      else {
        if ((uint)(wVar1 + L'\xffffffbf') < 6) {
          uVar6 = wVar1 + L'\xffffffc9';
          goto LAB_005b7af2;
        }
        if ((uint)(wVar1 + L'\xffffff9f') < 6) {
          uVar6 = wVar1 + L'\xffffffa9';
          goto LAB_005b7af2;
        }
        if (wVar1 == L'-') {
          if (uVar5 == 0 || !bParseInteriorHyphen) goto LAB_005b7b4e;
LAB_005b7b34:
          bVar9 = pwVar4 == pwVar3 + -1;
          pwVar4 = pwVar3;
          if (bVar9) goto LAB_005b7b4e;
        }
        else {
          if (wVar1 != L' ') goto LAB_005b7b4e;
          if (!bParseLeasingSpaces || uVar5 != 0) {
            if (uVar5 != 0 && bParseInteriorSpace) goto LAB_005b7b34;
            goto LAB_005b7b4e;
          }
          uVar5 = 0;
        }
      }
      lVar8 = lVar8 + 1;
    }
    if (((int)lVar8 <= iVar2 && uVar5 == 0x28) &&
       ((iVar2 <= lVar8 || (bVar9 = ON_wString::IsHexDigit(pwVar3[lVar8]), !bVar9)))) {
      ON_SHA1_Hash(__return_storage_ptr__);
      for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 1) {
        __return_storage_ptr__->m_digest[lVar8] =
             (char)(local_d8[lVar8 * 2] << 4) + (char)local_d8[lVar8 * 2 + 1];
      }
      return __return_storage_ptr__;
    }
LAB_005b7b4e:
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = failure_return_value.m_digest._16_4_;
  }
  *(undefined4 *)__return_storage_ptr__->m_digest = failure_return_value.m_digest._0_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 4) = failure_return_value.m_digest._4_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 8) = failure_return_value.m_digest._8_4_;
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0xc) = failure_return_value.m_digest._12_4_;
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SHA1_Hash::FromString(
  const ON_wString string_to_parse,
  bool bParseLeasingSpaces,
  bool bParseInteriorSpace,
  bool bParseInteriorHyphen,
  ON_SHA1_Hash failure_return_value
)
{
  const wchar_t* s = static_cast<const wchar_t*>(string_to_parse);
  if (nullptr == s)
    return failure_return_value;

  unsigned digit_count = 0;
  int digits[40] = {};
  const wchar_t* skipped = nullptr;
  const int len = string_to_parse.Length();
  int sdex = 0;
  for (/* empty init */; sdex < len && digit_count < 40; ++sdex)
  {
    const int c = (int)s[sdex];
    if (c >= '0' && c <= '9')
    {
      digits[digit_count++] = (c - '0');
    }
    else if (c >= 'A' && c <= 'F')
    {
      digits[digit_count++] = (c - 'A') + 10;
    }
    else if (c >= 'a' && c <= 'f')
    {
      digits[digit_count++] = (c - 'a') + 10;
    }
    else  if ((int)(ON_wString::Space) == c)
    {
      if (bParseLeasingSpaces && 0 == digit_count)
        continue; // skip leading white space

      if (bParseInteriorSpace && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else  if ((int)(ON_wString::HyphenMinus) == c)
    {
      if (bParseInteriorHyphen && digit_count > 0 && skipped != s - 1)
        skipped = s;
      else
        break;
    }
    else
      break;
  }

  if (40 != digit_count || sdex > len || (sdex < len && true == ON_wString::IsHexDigit(s[sdex])))
    return failure_return_value;

  ON_SHA1_Hash h;
  int i = 0;
  for(int j = 0; j < 20; ++j, ++i, ++i)
    h.m_digest[j] = (ON__UINT8)(16 * digits[i] + digits[i + 1]);
  return h;
}